

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trmm.cpp
# Opt level: O2

double benchmark<remora::triangular_tag<false,false>,remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::column_major,remora::cpu_tag>>
                 (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                  *A,matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                     *B,matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *C)

{
  double dVar1;
  long lVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  Timer time;
  
  dVar6 = 1.79769313486232e+308;
  lVar2 = 10;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    Timer::Timer(&time,true);
    local_90 = *(undefined8 *)(A + 0x10);
    local_68 = *(undefined8 *)B;
    local_60 = *(undefined8 *)(B + 8);
    local_70 = *(undefined8 *)(B + 0x10);
    local_88 = *(undefined8 *)A;
    uStack_80 = *(undefined8 *)(A + 8);
    local_50 = 0x3ff0000000000000;
    local_a8 = *(undefined4 *)C;
    uStack_a4 = *(undefined4 *)(C + 4);
    uStack_a0 = *(undefined4 *)(C + 8);
    uStack_9c = *(undefined4 *)(C + 0xc);
    local_b0 = *(undefined8 *)(C + 0x10);
    local_98 = local_a8;
    uStack_94 = uStack_a4;
    local_78 = local_88;
    local_58 = local_60;
    remora::
    matrix_matrix_prod<remora::dense_triangular_proxy<double_const,remora::column_major,remora::triangular_tag<false,false>,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
    ::
    plus_assign_to<remora::dense_matrix_adaptor<double,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>>
              ((matrix_matrix_prod<remora::dense_triangular_proxy<double_const,remora::column_major,remora::triangular_tag<false,false>,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                *)&local_90,&local_b0);
    dVar1 = Timer::stop(&time);
    uVar4 = SUB84(dVar1,0);
    uVar5 = (undefined4)((ulong)dVar1 >> 0x20);
    if (dVar6 <= dVar1) {
      uVar4 = SUB84(dVar6,0);
      uVar5 = (undefined4)((ulong)dVar6 >> 0x20);
    }
    dVar6 = (double)CONCAT44(uVar5,uVar4);
  }
  return (((((double)CONCAT44(0x45300000,(int)((ulong)*(undefined8 *)(B + 8) >> 0x20)) -
            1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)*(undefined8 *)(B + 8)) - 4503599627370496.0)) *
          (((double)CONCAT44(0x45300000,(int)((ulong)*(undefined8 *)(A + 8) >> 0x20)) -
           1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)*(undefined8 *)(A + 8)) - 4503599627370496.0)) *
          (((double)CONCAT44(0x45300000,(int)((ulong)*(undefined8 *)A >> 0x20)) -
           1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)*(undefined8 *)A) - 4503599627370496.0)) * 0.5) / dVar6)
         * 0.0009765625 * 0.0009765625;
}

Assistant:

double benchmark(
	matrix_expression<AMat, cpu_tag> const& A,
	matrix_expression<BMat, cpu_tag> const& B,
	matrix_expression<CMat, cpu_tag> & C
){
	double minTime = std::numeric_limits<double>::max();
	for(std::size_t i = 0; i != 10; ++i){
		Timer time;
		noalias(C) += triangular_prod<Triangular>(A,B);
		minTime = std::min(minTime,time.stop());
	}
	return (0.5*A().size1()*A().size2()*B().size2())/minTime/1024/1024;
}